

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_customTypeOutputParameterOfWrongType_Test::testBody
          (TEST_MockComparatorCopierTest_customTypeOutputParameterOfWrongType_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  MockCheckedExpectedCall *pMVar3;
  UtestShell *test;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SimpleString local_238;
  SimpleString local_228;
  SimpleString local_218;
  SimpleString local_208;
  SimpleString local_1f8;
  SimpleString local_1e8;
  SimpleString local_1d8;
  SimpleString local_1c8;
  SimpleString local_1b8;
  SimpleString local_1a8;
  SimpleString local_198;
  undefined1 local_188 [8];
  MockUnexpectedOutputParameterFailure expectedFailure;
  SimpleString local_110;
  undefined1 local_100 [8];
  MockNamedValue parameter;
  SimpleString local_a0;
  SimpleString local_90;
  undefined1 local_80 [8];
  MockExpectedCallsListForTest expectations;
  SimpleString local_60;
  MyTypeForTestingCopier local_50;
  MyTypeForTestingCopier copier;
  MyTypeForTesting actualObject;
  undefined1 local_28 [8];
  MyTypeForTesting expectedObject;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockComparatorCopierTest_customTypeOutputParameterOfWrongType_Test *this_local;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)((long)&expectedObject.value + 7));
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)local_28,0x1e248);
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)&copier,0x1277e);
  MyTypeForTestingCopier::MyTypeForTestingCopier(&local_50);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString
            ((SimpleString *)&expectations.super_MockExpectedCallsList.head_,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])
            (pMVar2,&expectations.super_MockExpectedCallsList.head_,&local_50);
  SimpleString::~SimpleString((SimpleString *)&expectations.super_MockExpectedCallsList.head_);
  SimpleString::~SimpleString(&local_60);
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_80);
  SimpleString::SimpleString(&local_90,"foo");
  pMVar3 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)local_80,&local_90);
  SimpleString::SimpleString(&local_a0,"MyTypeForTesting");
  SimpleString::SimpleString((SimpleString *)&parameter.copier_,"output");
  (*(pMVar3->super_MockExpectedCall)._vptr_MockExpectedCall[7])
            (pMVar3,&local_a0,&parameter.copier_,local_28);
  SimpleString::~SimpleString((SimpleString *)&parameter.copier_);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::SimpleString(&local_110,"output");
  MockNamedValue::MockNamedValue((MockNamedValue *)local_100,&local_110);
  SimpleString::~SimpleString(&local_110);
  SimpleString::SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,
             "OtherTypeForTesting");
  MockNamedValue::setConstObjectPointer
            ((MockNamedValue *)local_100,
             (SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,&copier);
  SimpleString::~SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_198,"foo");
  MockUnexpectedOutputParameterFailure::MockUnexpectedOutputParameterFailure
            ((MockUnexpectedOutputParameterFailure *)local_188,test,&local_198,
             (MockNamedValue *)local_100,(MockExpectedCallsList *)local_80);
  SimpleString::~SimpleString(&local_198);
  SimpleString::SimpleString(&local_1a8,"");
  pMVar2 = mock(&local_1a8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_1b8,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_1b8);
  SimpleString::SimpleString(&local_1c8,"MyTypeForTesting");
  SimpleString::SimpleString(&local_1d8,"output");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
            ((long *)CONCAT44(extraout_var,iVar1),&local_1c8,&local_1d8,local_28);
  SimpleString::~SimpleString(&local_1d8);
  SimpleString::~SimpleString(&local_1c8);
  SimpleString::~SimpleString(&local_1b8);
  SimpleString::~SimpleString(&local_1a8);
  SimpleString::SimpleString(&local_1e8,"");
  pMVar2 = mock(&local_1e8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_1f8,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_1f8);
  SimpleString::SimpleString(&local_208,"OtherTypeForTesting");
  SimpleString::SimpleString(&local_218,"output");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x30))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_208,&local_218,&copier);
  SimpleString::~SimpleString(&local_218);
  SimpleString::~SimpleString(&local_208);
  SimpleString::~SimpleString(&local_1f8);
  SimpleString::~SimpleString(&local_1e8);
  SimpleString::SimpleString(&local_228,"");
  pMVar2 = mock(&local_228,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_228);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_188,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0x106);
  SimpleString::SimpleString(&local_238,"");
  pMVar2 = mock(&local_238,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])();
  SimpleString::~SimpleString(&local_238);
  MockUnexpectedOutputParameterFailure::~MockUnexpectedOutputParameterFailure
            ((MockUnexpectedOutputParameterFailure *)local_188);
  MockNamedValue::~MockNamedValue((MockNamedValue *)local_100);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_80);
  MyTypeForTestingCopier::~MyTypeForTestingCopier(&local_50);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)&copier);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)local_28);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)((long)&expectedObject.value + 7));
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customTypeOutputParameterOfWrongType)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting expectedObject(123464);
    MyTypeForTesting actualObject(75646);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    MockNamedValue parameter("output");
    parameter.setConstObjectPointer("OtherTypeForTesting", &actualObject);
    MockUnexpectedOutputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock().expectOneCall("foo").withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    mock().actualCall("foo").withOutputParameterOfType("OtherTypeForTesting", "output", &actualObject);

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);

    mock().removeAllComparatorsAndCopiers();
}